

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void fio_pubsub_reattach(fio_pubsub_engine_s *eng)

{
  channel_s *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [24];
  undefined1 auVar7 [24];
  fio_ch_set__ordered_s_ *pfVar8;
  fio_lock_i ret;
  timespec local_58;
  undefined8 local_40;
  size_t sStack_38;
  char *local_30;
  undefined8 local_28;
  size_t sStack_20;
  char *local_18;
  
  LOCK();
  UNLOCK();
  local_58.tv_sec = CONCAT71(local_58.tv_sec._1_7_,fio_postoffice.pubsub.lock);
  if (fio_postoffice.pubsub.lock != '\0') {
    do {
      fio_postoffice.pubsub.lock = '\x01';
      local_58.tv_sec = 0;
      local_58.tv_nsec = 1;
      nanosleep(&local_58,(timespec *)0x0);
      LOCK();
      UNLOCK();
      local_58.tv_sec = CONCAT71(local_58.tv_sec._1_7_,fio_postoffice.pubsub.lock);
    } while (fio_postoffice.pubsub.lock != '\0');
  }
  fio_postoffice.pubsub.lock = '\x01';
  pfVar8 = fio_postoffice.pubsub.channels.ordered;
  if (fio_postoffice.pubsub.channels.ordered != (fio_ch_set__ordered_s_ *)0x0) {
    for (; pfVar8 < fio_postoffice.pubsub.channels.ordered + fio_postoffice.pubsub.channels.pos;
        pfVar8 = pfVar8 + 1) {
      if (pfVar8->hash != 0) {
        local_28 = 0;
        pcVar1 = pfVar8->obj;
        sStack_20 = pcVar1->name_len;
        local_18 = pcVar1->name;
        uVar2 = pcVar1->name_len;
        uVar3 = pcVar1->name;
        auVar6._8_8_ = uVar3;
        auVar6._0_8_ = uVar2;
        auVar6._16_8_ = 0;
        (*eng->subscribe)(eng,(fio_str_info_s)(auVar6 << 0x40),(fio_match_fn)0x0);
      }
    }
  }
  LOCK();
  fio_postoffice.pubsub.lock = '\0';
  UNLOCK();
  LOCK();
  UNLOCK();
  local_58.tv_sec = CONCAT71((int7)((ulong)local_58.tv_sec >> 8),fio_postoffice.patterns.lock);
  if (fio_postoffice.patterns.lock != '\0') {
    do {
      fio_postoffice.patterns.lock = '\x01';
      local_58.tv_sec = 0;
      local_58.tv_nsec = 1;
      nanosleep(&local_58,(timespec *)0x0);
      LOCK();
      UNLOCK();
      local_58.tv_sec = CONCAT71(local_58.tv_sec._1_7_,fio_postoffice.patterns.lock);
    } while (fio_postoffice.patterns.lock != '\0');
  }
  fio_postoffice.patterns.lock = '\x01';
  pfVar8 = fio_postoffice.patterns.channels.ordered;
  if (fio_postoffice.patterns.channels.ordered != (fio_ch_set__ordered_s_ *)0x0) {
    for (; pfVar8 < fio_postoffice.patterns.channels.ordered + fio_postoffice.patterns.channels.pos;
        pfVar8 = pfVar8 + 1) {
      if (pfVar8->hash != 0) {
        local_40 = 0;
        pcVar1 = pfVar8->obj;
        sStack_38 = pcVar1->name_len;
        local_30 = pcVar1->name;
        uVar4 = pcVar1->name_len;
        uVar5 = pcVar1->name;
        auVar7._8_8_ = uVar5;
        auVar7._0_8_ = uVar4;
        auVar7._16_8_ = 0;
        (*eng->subscribe)(eng,(fio_str_info_s)(auVar7 << 0x40),pcVar1->match);
      }
    }
  }
  LOCK();
  fio_postoffice.patterns.lock = '\0';
  UNLOCK();
  return;
}

Assistant:

void fio_pubsub_reattach(fio_pubsub_engine_s *eng) {
  fio_lock(&fio_postoffice.pubsub.lock);
  FIO_SET_FOR_LOOP(&fio_postoffice.pubsub.channels, pos) {
    if (!pos->hash)
      continue;
    eng->subscribe(
        eng,
        (fio_str_info_s){.data = pos->obj->name, .len = pos->obj->name_len},
        NULL);
  }
  fio_unlock(&fio_postoffice.pubsub.lock);
  fio_lock(&fio_postoffice.patterns.lock);
  FIO_SET_FOR_LOOP(&fio_postoffice.patterns.channels, pos) {
    if (!pos->hash)
      continue;
    eng->subscribe(
        eng,
        (fio_str_info_s){.data = pos->obj->name, .len = pos->obj->name_len},
        pos->obj->match);
  }
  fio_unlock(&fio_postoffice.patterns.lock);
}